

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddExtension
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *filename,
          FieldDescriptorProto *field,FileDescriptorProto *value)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  char *pcVar4;
  LogMessage *this_00;
  LogMessage *other;
  string *in_stack_fffffffffffffeb8;
  LogMessage *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  LogLevel_conflict level;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  second_type *in_stack_ffffffffffffff00;
  first_type *in_stack_ffffffffffffff08;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>_>
  *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff4c;
  LogMessage *in_stack_ffffffffffffff50;
  string local_70 [112];
  
  FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)0x537231);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar3 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)0x53724e);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psVar3);
    if (*pcVar4 == '.') {
      psVar3 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)0x537281);
      std::__cxx11::string::substr((ulong)local_70,(ulong)psVar3);
      FieldDescriptorProto::number((FieldDescriptorProto *)0x5372aa);
      std::make_pair<std::__cxx11::string,int>
                (in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0);
      level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      bVar1 = InsertIfNotPresent<std::map<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>>
                        (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff00);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)0x537311);
      std::__cxx11::string::~string(local_70);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),level
                   ,(char *)in_stack_fffffffffffffec0,
                   (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)0x537373);
        internal::LogMessage::operator<<(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)0x5373b5);
        internal::LogMessage::operator<<(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        FieldDescriptorProto::number((FieldDescriptorProto *)0x5373f7);
        internal::LogMessage::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        this_00 = internal::LogMessage::operator<<
                            (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        other = internal::LogMessage::operator<<(this_00,in_stack_fffffffffffffeb8);
        internal::LogFinisher::operator=((LogFinisher *)this_00,other);
        internal::LogMessage::~LogMessage((LogMessage *)0x537462);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddExtension(
    const std::string& filename, const FieldDescriptorProto& field,
    Value value) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!InsertIfNotPresent(
            &by_extension_,
            std::make_pair(field.extendee().substr(1), field.number()),
            value)) {
      GOOGLE_LOG(ERROR) << "Extension conflicts with extension already in database: "
                    "extend "
                 << field.extendee() << " { " << field.name() << " = "
                 << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}